

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

int main(void)

{
  int iVar1;
  CMUnitTest tests [19];
  undefined1 auStackY_308 [128];
  CMFixtureFunction in_stack_fffffffffffffd78;
  CMFixtureFunction in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  CMUnitTest *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  
  tellmeall();
  memcpy(auStackY_308,&PTR_anon_var_dwarf_100_00181ae0,0x2f8);
  iVar1 = _cmocka_run_group_tests
                    (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                     in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  return iVar1;
}

Assistant:

int main() {
    tellmeall();
#if CROARING_IS_BIG_ENDIAN
    printf("Big-endian IO unsupported.\n");
    return EXIT_SUCCESS;
#else
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(test_robust_deserialize1),
        cmocka_unit_test(test_robust_deserialize2),
        cmocka_unit_test(test_robust_deserialize3),
        cmocka_unit_test(test_robust_deserialize4),
        cmocka_unit_test(test_robust_deserialize5),
        cmocka_unit_test(test_robust_deserialize6),
        cmocka_unit_test(test_robust_deserialize7),
        cmocka_unit_test(deserialize_negative_container_count),
        cmocka_unit_test(deserialize_huge_container_count),
        cmocka_unit_test(deserialize_duplicate_keys),
        cmocka_unit_test(deserialize_unsorted_keys),
        cmocka_unit_test(deserialize_duplicate_array),
        cmocka_unit_test(deserialize_unsorted_array),
        cmocka_unit_test(deserialize_bitset_incorrect_cardinality),
        cmocka_unit_test(deserialize_run_container_empty),
        cmocka_unit_test(deserialize_run_container_should_combine),
        cmocka_unit_test(deserialize_run_container_overlap),
        cmocka_unit_test(deserialize_run_container_overflow),
        cmocka_unit_test(
            deserialize_run_container_incorrect_cardinality_still_allowed),
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
#endif
}